

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_quadrature.hpp
# Opt level: O2

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::LebedevLaikov<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>
            *q1,Quadrature<IntegratorXX::LebedevLaikov<double>_> *q2)

{
  double dVar1;
  double dVar2;
  pointer paVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t i;
  long lVar11;
  size_type __n;
  allocator_type local_61;
  weight_container weights;
  point_container points;
  
  lVar7 = (long)(q1->
                super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(q1->
                super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  lVar5 = ((long)(q2->
                 super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                 ).points_.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(q2->
                super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  __n = lVar5 * lVar7;
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (&points,__n,(allocator_type *)&weights);
  std::vector<double,_std::allocator<double>_>::vector(&weights,__n,&local_61);
  lVar6 = 2;
  lVar8 = 0;
  for (lVar9 = 0; lVar9 != lVar5; lVar9 = lVar9 + 1) {
    lVar10 = lVar6;
    for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 1) {
      paVar3 = (q2->
               super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
               ).points_.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar1 = (q1->
              super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
              ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      dVar2 = *(double *)((long)(paVar3 + lVar9) + 0x10);
      paVar3 = paVar3 + lVar9;
      dVar4 = *(double *)((long)paVar3->_M_elems + 8);
      (points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar10 + -2] =
           dVar1 * paVar3->_M_elems[0];
      ((points.
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar10 + -2)[1] = dVar1 * dVar4;
      (points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar10] = dVar2 * dVar1;
      *(double *)
       ((long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11 * 8 + lVar8) =
           (q1->
           super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           ).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11] *
           (q2->
           super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar9];
      lVar10 = lVar10 + 3;
    }
    lVar8 = lVar8 + lVar7 * 8;
    lVar6 = lVar6 + lVar7 * 3;
  }
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,&points,&weights);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
  ~_Vector_base(&points.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               );
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( const Quadrature<Quad1>& q1, const Quadrature<Quad2>& q2 ) {

    const auto npts1 = q1.npts();
    const auto npts2 = q2.npts();

    const auto npts = npts1 * npts2;
    point_container  points( npts );
    weight_container weights( npts );
    
    const auto& points1  = q1.points();
    const auto& weights1 = q1.weights();
    const auto& points2  = q2.points();
    const auto& weights2 = q2.weights();

    CombineOp op;

    for( size_t j = 0; j < npts2; ++j ) 
    for( size_t i = 0; i < npts1; ++i ) {

      const auto ij = i + j*npts1;
      points[ij]  = op(points1[i],  points2[j] );
      weights[ij] = op(weights1[i], weights2[j]);

    }

    return std::make_tuple( points, weights );
  }